

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

uint8_t * encode_sleb128(uint8_t *p,target_long_conflict val)

{
  uint8_t *puVar1;
  
  puVar1 = p + 1;
  while ((0x3f < (uint)val && ((val >> 7 == 0xffffffffU & (byte)((val & 0x40U) >> 6)) == 0))) {
    puVar1[-1] = (byte)val | 0x80;
    puVar1 = puVar1 + 1;
    val = val >> 7;
  }
  puVar1[-1] = (byte)val & 0x7f;
  return puVar1;
}

Assistant:

static uint8_t *encode_sleb128(uint8_t *p, target_long val)
{
    int more, byte;

    do {
        byte = val & 0x7f;
        val >>= 7;
        more = !((val == 0 && (byte & 0x40) == 0)
                 || (val == -1 && (byte & 0x40) != 0));
        if (more) {
            byte |= 0x80;
        }
        *p++ = byte;
    } while (more);

    return p;
}